

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_log_contexts.cpp
# Opt level: O3

void __thiscall
duckdb::DuckDBLogContextData::DuckDBLogContextData
          (DuckDBLogContextData *this,shared_ptr<duckdb::LogStorage,_true> *log_storage_p)

{
  unique_ptr<duckdb::LogStorageScanState,_std::default_delete<duckdb::LogStorageScanState>,_true>
  *this_00;
  _Head_base<0UL,_duckdb::LogStorageScanState_*,_false> _Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Head_base<0UL,_duckdb::LogStorageScanState_*,_false> _Var4;
  LogStorage *pLVar5;
  type pLVar6;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::LogStorageScanState_*,_false> local_20;
  
  (this->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__DuckDBLogContextData_01983888;
  (this->log_storage).internal.super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (log_storage_p->internal).
           super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (log_storage_p->internal).
           super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (log_storage_p->internal).super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->log_storage).internal.super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar2;
  (this->log_storage).internal.super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  (log_storage_p->internal).super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  this_00 = &this->scan_state;
  (this->scan_state).
  super_unique_ptr<duckdb::LogStorageScanState,_std::default_delete<duckdb::LogStorageScanState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::LogStorageScanState,_std::default_delete<duckdb::LogStorageScanState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogStorageScanState_*,_std::default_delete<duckdb::LogStorageScanState>_>
  .super__Head_base<0UL,_duckdb::LogStorageScanState_*,_false>._M_head_impl =
       (LogStorageScanState *)0x0;
  pLVar5 = shared_ptr<duckdb::LogStorage,_true>::operator->(&this->log_storage);
  (*pLVar5->_vptr_LogStorage[9])(&local_20,pLVar5);
  _Var4._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (LogStorageScanState *)0x0;
  _Var1._M_head_impl =
       (this_00->
       super_unique_ptr<duckdb::LogStorageScanState,_std::default_delete<duckdb::LogStorageScanState>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::LogStorageScanState,_std::default_delete<duckdb::LogStorageScanState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogStorageScanState_*,_std::default_delete<duckdb::LogStorageScanState>_>
       .super__Head_base<0UL,_duckdb::LogStorageScanState_*,_false>._M_head_impl;
  (this_00->
  super_unique_ptr<duckdb::LogStorageScanState,_std::default_delete<duckdb::LogStorageScanState>_>).
  _M_t.
  super___uniq_ptr_impl<duckdb::LogStorageScanState,_std::default_delete<duckdb::LogStorageScanState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogStorageScanState_*,_std::default_delete<duckdb::LogStorageScanState>_>
  .super__Head_base<0UL,_duckdb::LogStorageScanState_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var1._M_head_impl != (LogStorageScanState *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_LogStorageScanState[1])();
    if (local_20._M_head_impl != (LogStorageScanState *)0x0) {
      (*(local_20._M_head_impl)->_vptr_LogStorageScanState[1])();
    }
  }
  pLVar5 = shared_ptr<duckdb::LogStorage,_true>::operator->(&this->log_storage);
  pLVar6 = unique_ptr<duckdb::LogStorageScanState,_std::default_delete<duckdb::LogStorageScanState>,_true>
           ::operator*(this_00);
  (*pLVar5->_vptr_LogStorage[0xb])(pLVar5,pLVar6);
  return;
}

Assistant:

explicit DuckDBLogContextData(shared_ptr<LogStorage> log_storage_p) : log_storage(std::move(log_storage_p)) {
		scan_state = log_storage->CreateScanContextsState();
		log_storage->InitializeScanContexts(*scan_state);
	}